

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.cpp
# Opt level: O0

bool __thiscall
axl::cry::Rsa::signHash
          (Rsa *this,int type,Array<char,_axl::sl::ArrayDetails<char>_> *signature,void *hash,
          size_t hashSize)

{
  undefined1 uVar1;
  void *signatureBuffer;
  size_t sVar2;
  Rsa *in_RCX;
  undefined4 in_ESI;
  Array<char,_axl::sl::ArrayDetails<char>_> *in_RDI;
  undefined8 in_R8;
  size_t size;
  bool result;
  size_t signatureBufferSize;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  void *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  int type_00;
  undefined1 local_1;
  
  type_00 = (int)((ulong)in_R8 >> 0x20);
  signatureBuffer = (void *)getSize((Rsa *)0x15131b);
  uVar1 = sl::Array<char,_axl::sl::ArrayDetails<char>_>::setCount
                    (in_RDI,CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if ((bool)uVar1) {
    sl::Array<char,_axl::sl::ArrayDetails<char>_>::p(in_RDI);
    sVar2 = signHash(in_RCX,type_00,signatureBuffer,CONCAT17(uVar1,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffb8,(size_t)in_RDI);
    if (sVar2 == 0xffffffffffffffff) {
      local_1 = false;
    }
    else {
      sl::Array<char,_axl::sl::ArrayDetails<char>_>::setCount
                (in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffa8));
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
Rsa::signHash(
	int type,
	sl::Array<char>* signature,
	const void* hash,
	size_t hashSize
) {
	size_t signatureBufferSize = getSize();
	bool result = signature->setCount(signatureBufferSize);
	if (!result)
		return false;

	size_t size = signHash(type, signature->p(), signatureBufferSize, hash, hashSize);
	if (size == -1)
		return false;

	ASSERT(size <= signatureBufferSize);
	signature->setCount(size);
	return true;
}